

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O3

PCSTR TagToStringCxx(int tag)

{
  uint uVar1;
  
  uVar1 = tag & 0xff;
  if (uVar1 < 0x40) {
    if (uVar1 != 0) {
      if (uVar1 == 1) {
        return "bool";
      }
      if (uVar1 == 2) {
        return "void*";
      }
      goto LAB_00114436;
    }
  }
  else {
    switch(uVar1) {
    case 0x7c:
      return "double";
    case 0x7d:
      return "float";
    case 0x7e:
      return "int64_t";
    case 0x7f:
      return "int";
    case 0x80:
      return "Value";
    case 0x81:
      return "Label";
    case 0x82:
      return "Frame";
    }
    if (uVar1 != 0x40) {
LAB_00114436:
      return "unknown";
    }
  }
  return "void";
}

Assistant:

PCSTR TagToStringCxx (int tag)
{
    switch ((w3Tag)tag)
    {
    default:break;
    case Tag_none:     return "void";
    case Tag_bool:     return "bool";
    case Tag_any:      return "void*"; // union?
    case Tag_i32:      return "int";
    case Tag_i64:      return "int64_t";
    case Tag_f32:      return "float";
    case Tag_f64:      return "double";
    case Tag_empty:    return "void";
    case Tag_Value:    return "Value";
    case Tag_Label:    return "Label";
    case Tag_Frame:    return "Frame";
    }
    return "unknown";
}